

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTcSymFunc::gen_code_call
          (CTcSymFunc *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  CVmHashEntry **ppCVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  CTcSymFuncBase *this_00;
  undefined4 in_register_0000000c;
  size_t __n;
  ulong *puVar7;
  void *__buf;
  uint16_t tmp_1;
  uchar opc;
  int iVar8;
  char *pcVar9;
  CTcGenTarg *pCVar10;
  char buf [4];
  undefined4 uStack_b4;
  
  __n = CONCAT44(in_register_0000000c,varargs);
  bVar2 = (this->super_CTcSymFuncBase).field_0x80;
  if (-1 < (char)bVar2) {
    CTcTokenizer::log_error
              (0x2d2e,(ulong)(uint)(this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                                   super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_);
    return;
  }
  iVar8 = (int)buf;
  if ((bVar2 & 0x20) == 0) {
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,'v');
    }
    CTcGenTarg::write_op(G_cg,'X');
    buf[0] = (char)argc;
    CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,__n);
    if ((G_cg->field_0xd0 & 4) == 0) {
      CTcSymFuncBase::add_abs_fixup(&this->super_CTcSymFuncBase,&G_cs->super_CTcDataStream);
      _buf = (undefined **)((ulong)_buf & 0xffffffff00000000);
    }
    else {
      puVar7 = &((this->super_CTcSymFuncBase).anchor_)->addr_;
      if ((this->field_0x90 & 1) != 0) {
        puVar7 = &this->abs_addr_;
      }
      uVar3 = (uint)*puVar7;
      __n = (size_t)uVar3;
      buf[0] = (char)uVar3;
      buf[1] = (char)(uVar3 >> 8);
      buf[2] = (char)(uVar3 >> 0x10);
      buf[3] = (char)(uVar3 >> 0x18);
    }
    pCVar10 = (CTcGenTarg *)G_cs;
    CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x4,__n);
    G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    CTcGenTarg::post_call_cleanup(pCVar10,named_args);
    iVar8 = (this->super_CTcSymFuncBase).argc_;
    if ((argc < iVar8) ||
       ((((this->super_CTcSymFuncBase).field_0x80 & 1) == 0 &&
        (iVar8 + (this->super_CTcSymFuncBase).opt_argc_ < argc)))) {
      sVar5 = (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
              super_CVmHashEntry.len_;
      pcVar9 = (this->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS
               .super_CVmHashEntry.str_;
      pcVar6 = CTcSymFuncBase::get_argc_desc(&this->super_CTcSymFuncBase,buf);
      CTcTokenizer::log_error(0x2d13,(ulong)(uint)sVar5,pcVar9,pcVar6,(ulong)(uint)argc);
    }
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar10 = G_cg;
    iVar4 = G_cg->sp_depth_;
    iVar8 = iVar4 + 1;
    G_cg->sp_depth_ = iVar8;
    if (iVar4 < pCVar10->max_sp_depth_) {
      return;
    }
    pCVar10->max_sp_depth_ = iVar8;
    return;
  }
  if (varargs == 0) {
    if (0xff < argc) {
      CTcGenTarg::write_op(G_cg,0xc1);
      buf[0] = (char)(short)argc;
      buf[1] = (char)((ushort)(short)argc >> 8);
      __buf = (void *)0x2;
      goto LAB_0024a58f;
    }
    opc = 0xc0;
  }
  else {
    opc = 'v';
  }
  CTcGenTarg::write_op(G_cg,opc);
  buf[0] = (char)argc;
  __buf = (void *)0x1;
LAB_0024a58f:
  CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,__buf,__n);
  buf[0] = (char)G_cg->predef_meta_idx_[1];
  CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,__n);
  pCVar10 = G_cg;
  G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
  CTcGenTarg::write_op(pCVar10,0x8b);
  pCVar10 = G_cg;
  iVar8 = G_cg->sp_depth_;
  G_cg->sp_depth_ = iVar8 + 1;
  if (pCVar10->max_sp_depth_ <= iVar8) {
    pCVar10->max_sp_depth_ = iVar8 + 1;
  }
  _buf = &PTR_gen_code_0035f6b8;
  CTPNConst::gen_code((CTPNConst *)buf,0,iVar8);
  pcVar9 = "_multiMethodCall";
  this_00 = (CTcSymFuncBase *)
            CTcPrsSymtab::find_delete_weak(G_prs->global_symtab_,"_multiMethodCall",0x10);
  if (this_00 == (CTcSymFuncBase *)0x0) {
    this_00 = (CTcSymFuncBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar9);
    CTcSymFuncBase::CTcSymFuncBase(this_00,"_multiMethodCall",0x10,0,1,0,1,1,0,0,1,1);
    (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_003633b8;
    ppCVar1 = &this_00[1].super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
               super_CVmHashEntry.nxt_;
    *(byte *)ppCVar1 = *(byte *)ppCVar1 & 0xfe;
    this_00[1].super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)0x0;
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this_00);
  }
  else if (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                    super_CVmHashEntry.field_0x24 != 1) {
    this_00 = (CTcSymFuncBase *)0x0;
    CTcTokenizer::log_error(0x2b58,0x10,"_multiMethodCall");
  }
  if (this_00 != (CTcSymFuncBase *)0x0) {
    (*(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry[0x1b])(this_00,discard,2,0,named_args);
  }
  return;
}

Assistant:

void CTcSymFunc::gen_code_call(int discard, int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    /* we can't call a function that doesn't have a prototype */
    if (!has_proto_)
    {
        G_tok->log_error(TCERR_FUNC_CALL_NO_PROTO,
                         (int)get_sym_len(), get_sym());
        return;
    }

    /*
     *   If this is a multi-method base function, a call to the function is
     *   actually a call to _multiMethodCall('name', args).  
     */
    if (is_multimethod_base_)
    {
        /* make a list out of the arguments */
        if (varargs)
        {
            G_cg->write_op(OPC_VARARGC);
            G_cs->write((char)argc);
        }
        else if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
        }
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        G_cg->note_pop(argc);

        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();

        /* add the base function pointer argument */
        CTcConstVal funcval;
        funcval.set_funcptr(this);
        CTPNConst func(&funcval);
        func.gen_code(FALSE, FALSE);

        /* look up _multiMethodCall */
        CTcSymFunc *mmc = get_internal_func(
            "_multiMethodCall", 1, 0, TRUE, TRUE);

        /* 
         *   Generate the call.  Note that there are always two arguments at
         *   this point: the base function pointer, and the argument list.
         *   The argument list is just one argument because we've already
         *   constructed a list out of it.  
         */
        if (mmc != 0)
            mmc->gen_code_call(discard, 2, FALSE, named_args);
    }
    else
    {
        /* write the varargs modifier if appropriate */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);

        /* generate the call instruction and argument count */
        G_cg->write_op(OPC_CALL);
        G_cs->write((char)argc);

        /* check the mode */
        if (G_cg->is_eval_for_dyn())
        {
            /* 
             *   dynamic (run-time) compilation - we know the absolute
             *   address already, since all symbols are pre-resolved in the
             *   debugger 
             */
            G_cs->write4(get_code_pool_addr());
        }
        else
        {
            /* 
             *   Normal compilation - we won't know the function's address
             *   until after generation is completed, so add a fixup for the
             *   current location, then write a placeholder for the offset
             *   field.  
             */
            add_abs_fixup(G_cs);
            G_cs->write4(0);
        }

        /* call removes arguments */
        G_cg->note_pop(argc);

        /* do post-call cleanup: named arg removal, etc */
        G_cg->post_call_cleanup(named_args);

        /* make sure the argument count is correct */
        if (!argc_ok(argc))
        {
            char buf[128];
            G_tok->log_error(TCERR_WRONG_ARGC_FOR_FUNC,
                             (int)get_sym_len(), get_sym(),
                             get_argc_desc(buf), argc);
        }

        /* if we're not discarding, push the return value from R0 */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }
}